

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O0

void Msat_OrderUpdate(Msat_Order_t *p,int Var)

{
  abctime aVar1;
  abctime aVar2;
  abctime clk;
  int Var_local;
  Msat_Order_t *p_local;
  
  aVar1 = Abc_Clock();
  if (((-1 < Var) && (Var < p->vIndex->nSize)) && (p->vIndex->pArray[Var] != 0)) {
    Msat_HeapIncrease(p,Var);
  }
  aVar2 = Abc_Clock();
  timeSelect = (aVar2 - aVar1) + timeSelect;
  return;
}

Assistant:

void Msat_OrderUpdate( Msat_Order_t * p, int Var )
{
//    if (heap.inHeap(x))
//        heap.increase(x);

    abctime clk = Abc_Clock();
    if ( HINHEAP(p,Var) )
        Msat_HeapIncrease( p, Var );
timeSelect += Abc_Clock() - clk;
}